

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

void xmlSchematronFree(xmlSchematronPtr schema)

{
  xmlSchematronRulePtr pxVar1;
  xmlSchematronTestPtr pxVar2;
  xmlSchematronLetPtr pxVar3;
  xmlSchematronPatternPtr pxVar4;
  xmlSchematronTestPtr_conflict pxVar5;
  xmlSchematronLetPtr_conflict pxVar6;
  xmlSchematronRulePtr_conflict pxVar7;
  xmlSchematronPatternPtr_conflict pxVar8;
  
  if (schema == (xmlSchematronPtr)0x0) {
    return;
  }
  if ((schema->doc != (xmlDocPtr)0x0) && (schema->preserve == 0)) {
    xmlFreeDoc(schema->doc);
  }
  if (schema->namespaces != (xmlChar **)0x0) {
    (*xmlFree)(schema->namespaces);
  }
  pxVar7 = schema->rules;
  while (pxVar7 != (xmlSchematronRulePtr_conflict)0x0) {
    pxVar1 = pxVar7->next;
    pxVar5 = pxVar7->tests;
    while (pxVar5 != (xmlSchematronTestPtr_conflict)0x0) {
      pxVar2 = pxVar5->next;
      if (pxVar5->test != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5->test);
      }
      if (pxVar5->comp != (xmlXPathCompExprPtr)0x0) {
        xmlXPathFreeCompExpr(pxVar5->comp);
      }
      if (pxVar5->report != (xmlChar *)0x0) {
        (*xmlFree)(pxVar5->report);
      }
      (*xmlFree)(pxVar5);
      pxVar5 = pxVar2;
    }
    if (pxVar7->context != (xmlChar *)0x0) {
      (*xmlFree)(pxVar7->context);
    }
    if (pxVar7->pattern != (xmlPatternPtr)0x0) {
      xmlFreePattern(pxVar7->pattern);
    }
    if (pxVar7->report != (xmlChar *)0x0) {
      (*xmlFree)(pxVar7->report);
    }
    pxVar6 = pxVar7->lets;
    while (pxVar6 != (xmlSchematronLetPtr_conflict)0x0) {
      pxVar3 = pxVar6->next;
      if (pxVar6->name != (xmlChar *)0x0) {
        (*xmlFree)(pxVar6->name);
      }
      if (pxVar6->comp != (xmlXPathCompExprPtr)0x0) {
        xmlXPathFreeCompExpr(pxVar6->comp);
      }
      (*xmlFree)(pxVar6);
      pxVar6 = pxVar3;
    }
    (*xmlFree)(pxVar7);
    pxVar7 = pxVar1;
  }
  pxVar8 = schema->patterns;
  while (pxVar8 != (xmlSchematronPatternPtr_conflict)0x0) {
    pxVar4 = pxVar8->next;
    if (pxVar8->name != (xmlChar *)0x0) {
      (*xmlFree)(pxVar8->name);
    }
    (*xmlFree)(pxVar8);
    pxVar8 = pxVar4;
  }
  xmlDictFree(schema->dict);
  (*xmlFree)(schema);
  return;
}

Assistant:

void
xmlSchematronFree(xmlSchematronPtr schema)
{
    if (schema == NULL)
        return;

    if ((schema->doc != NULL) && (!(schema->preserve)))
        xmlFreeDoc(schema->doc);

    if (schema->namespaces != NULL)
        xmlFree((char **) schema->namespaces);

    xmlSchematronFreeRules(schema->rules);
    xmlSchematronFreePatterns(schema->patterns);
    xmlDictFree(schema->dict);
    xmlFree(schema);
}